

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef __thiscall Catch::anon_unknown_26::Duration::unitsAsString(Duration *this)

{
  Duration *this_local;
  
  switch(this->m_units) {
  case Nanoseconds:
    _this_local = operator____sr("ns",2);
    break;
  case Microseconds:
    _this_local = operator____sr("us",2);
    break;
  case Milliseconds:
    _this_local = operator____sr("ms",2);
    break;
  case Seconds:
    _this_local = operator____sr("s",1);
    break;
  case Minutes:
    _this_local = operator____sr("m",1);
    break;
  default:
    _this_local = operator____sr("** internal error **",0x14);
  }
  return _this_local;
}

Assistant:

StringRef unitsAsString() const {
        switch (m_units) {
        case Unit::Nanoseconds:
            return "ns"_sr;
        case Unit::Microseconds:
            return "us"_sr;
        case Unit::Milliseconds:
            return "ms"_sr;
        case Unit::Seconds:
            return "s"_sr;
        case Unit::Minutes:
            return "m"_sr;
        default:
            return "** internal error **"_sr;
        }

    }